

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::nextImage
          (TextureImageIterator *this)

{
  bool bVar1;
  deUint32 dVar2;
  IVec3 *baseSize;
  int *piVar3;
  undefined8 local_24;
  int local_1c;
  TextureImageIterator *local_18;
  TextureImageIterator *this_local;
  
  local_18 = this;
  bVar1 = hasNextImage(this);
  if (bVar1) {
    this->m_currentImage = this->m_currentImage + 1;
    if (this->m_currentImage == this->m_levelImageCount) {
      this->m_currentLevel = this->m_currentLevel + 1;
      this->m_currentImage = 0;
      dVar2 = ImageInfo::getTarget(&this->m_info);
      baseSize = ImageInfo::getSize(&this->m_info);
      getLevelSize((anon_unknown_0 *)&local_24,dVar2,baseSize,this->m_currentLevel);
      *(undefined8 *)(this->m_levelSize).m_data = local_24;
      (this->m_levelSize).m_data[2] = local_1c;
      dVar2 = getTarget(this);
      if (dVar2 == 0x8513) {
        this->m_levelImageCount = 6;
      }
      else {
        piVar3 = tcu::Vector<int,_3>::z(&this->m_levelSize);
        this->m_levelImageCount = *piVar3;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TextureImageIterator::nextImage (void)
{
	if (!hasNextImage())
		return false;

	m_currentImage++;
	if (m_currentImage == m_levelImageCount)
	{
		m_currentLevel++;
		m_currentImage		= 0;

		m_levelSize			= getLevelSize(m_info.getTarget(), m_info.getSize(), m_currentLevel);

		if (getTarget() == GL_TEXTURE_CUBE_MAP)
			m_levelImageCount = 6;
		else
			m_levelImageCount = m_levelSize.z();
	}
	DE_ASSERT(m_currentLevel < m_levelCount);
	DE_ASSERT(m_currentImage < m_levelImageCount);
	return true;
}